

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O0

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextBlock
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  allocator_type local_91;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_90;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_88;
  vector<char,_std::allocator<char>_> local_80;
  allocator_type local_51;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  vector<char,_std::allocator<char>_> local_38;
  vector<char,_std::allocator<char>_> *local_20;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *this_local;
  
  local_20 = buffer;
  buffer_local = (vector<char,_std::allocator<char>_> *)this;
  if (this->m_cachePos == 0) {
    bVar1 = readNextBlock(this);
    if (!bVar1) {
      return false;
    }
    local_88._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&this->m_cache);
    local_90._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->m_cache);
    std::allocator<char>::allocator();
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_80,local_88,local_90,&local_91);
    std::vector<char,_std::allocator<char>_>::operator=(local_20,&local_80);
    std::vector<char,_std::allocator<char>_>::~vector(&local_80);
    std::allocator<char>::~allocator(&local_91);
  }
  else {
    local_48._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&this->m_cache);
    local_40 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator+(&local_48,this->m_cachePos);
    local_50._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->m_cache);
    std::allocator<char>::allocator();
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_38,local_40,local_50,&local_51);
    std::vector<char,_std::allocator<char>_>::operator=(local_20,&local_38);
    std::vector<char,_std::allocator<char>_>::~vector(&local_38);
    std::allocator<char>::~allocator(&local_51);
    this->m_cachePos = 0;
  }
  return true;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextBlock( std::vector<T> &buffer) {
    // Return the last block-value if getNextLine was used before
    if ( 0 != m_cachePos ) {      
        buffer = std::vector<T>( m_cache.begin() + m_cachePos, m_cache.end() );
        m_cachePos = 0;
    } else {
        if ( !readNextBlock() ) {
            return false;
        }

        buffer = std::vector<T>(m_cache.begin(), m_cache.end());
    }

    return true;
}